

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cpp
# Opt level: O0

bool iDynTree::ArticulatedBodyAlgorithm
               (Model *model,Traversal *traversal,FreeFloatingPos *robotPos,
               FreeFloatingVel *robotVel,LinkNetExternalWrenches *linkExtWrenches,
               JointDOFsDoubleArray *jointTorques,ArticulatedBodyAlgorithmInternalBuffers *bufs,
               FreeFloatingAcc *robotAcc)

{
  Traversal *pTVar1;
  uint uVar2;
  IJoint *pIVar3;
  LinkIndex LVar4;
  uint uVar5;
  int iVar6;
  Twist *pTVar7;
  Twist *this;
  SpatialAcc *pSVar8;
  JointPosDoubleArray *pJVar9;
  LinkIndex LVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SpatialMotionVector *__dest;
  VectorDynSize *pVVar11;
  SpatialVector<iDynTree::SpatialMotionVector> *pSVar12;
  undefined4 extraout_var_01;
  SpatialInertia *pSVar13;
  ArticulatedBodyInertia *pAVar14;
  Wrench *pWVar15;
  undefined4 extraout_var_02;
  double *pdVar16;
  undefined4 extraout_var_03;
  SpatialAcc *pSVar17;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  SpatialForceVector *pSVar18;
  SpatialVector<iDynTree::SpatialForceVector> *this_00;
  undefined4 extraout_var_06;
  FreeFloatingVel *in_RCX;
  FreeFloatingPos *in_RDX;
  VectorDynSize *in_R9;
  double dVar19;
  double dVar20;
  double dVar21;
  long in_stack_00000008;
  FreeFloatingAcc *in_stack_00000010;
  size_t dofIndex_2;
  LinkIndex parentLinkIndex_2;
  IJointConstPtr toParentJoint_2;
  LinkConstPtr parentLink_2;
  LinkIndex visitedLinkIndex_2;
  LinkConstPtr visitedLink_2;
  uint traversalEl_2;
  Transform parent_X_visited;
  LinkIndex parentLinkIndex_1;
  size_t dofIndex_1;
  Wrench pa;
  ArticulatedBodyInertia Ia;
  IJointConstPtr toParentJoint_1;
  LinkConstPtr parentLink_1;
  LinkIndex visitedLinkIndex_1;
  LinkConstPtr visitedLink_1;
  int traversalEl_1;
  Twist vj;
  size_t dofIndex;
  LinkIndex parentLinkIndex;
  IJointConstPtr toParentJoint;
  LinkConstPtr parentLink;
  LinkIndex visitedLinkIndex;
  LinkConstPtr visitedLink;
  uint traversalEl;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffff138;
  Traversal *in_stack_fffffffffffff140;
  DualVectorT *in_stack_fffffffffffff158;
  SpatialVector<iDynTree::SpatialMotionVector> *in_stack_fffffffffffff160;
  StorageBaseType *in_stack_fffffffffffff180;
  double *in_stack_fffffffffffff188;
  SpatialAcc local_cc8;
  SpatialAcc local_c98;
  SpatialMotionVector local_c68;
  SpatialAcc local_c38;
  SpatialAcc local_c08;
  SpatialAcc local_bd8;
  SpatialAcc local_ba8;
  ulong local_b78;
  LinkIndex local_b70;
  undefined1 local_b68 [96];
  Traversal *local_b08;
  Link *local_b00;
  LinkIndex local_af8;
  Link *local_af0;
  uint local_ae4;
  Transform local_ae0 [56];
  Wrench local_aa8;
  Transform local_a70 [216];
  Wrench local_998;
  LinkIndex local_938;
  ArticulatedBodyInertia local_930 [56];
  Wrench local_8f8;
  SpatialForceVector local_8c0 [56];
  Wrench local_888;
  ArticulatedBodyInertia local_850 [56];
  Wrench local_818;
  Wrench local_7e0;
  SpatialForceVector local_7a8 [216];
  ArticulatedBodyInertia local_6d0 [216];
  ArticulatedBodyInertia local_5f8 [56];
  ulong local_5c0;
  Wrench local_5b8;
  SpatialAcc local_580 [4];
  IJoint *local_4a8;
  Link *local_4a0;
  LinkIndex local_498;
  Link *local_490;
  uint local_488;
  undefined1 local_478 [56];
  Wrench local_440;
  Wrench local_408;
  ArticulatedBodyInertia local_3d0 [216];
  SpatialAcc local_2f8;
  Transform local_2c8 [48];
  Twist local_298 [80];
  undefined8 local_248;
  undefined8 local_1f0;
  SpatialVector<iDynTree::SpatialMotionVector> local_1b8;
  undefined1 local_188 [48];
  ulong local_158;
  SpatialMotionVector local_150;
  SpatialAcc local_120;
  Transform local_f0 [48];
  LinkIndex local_c0;
  SpatialMotionVector local_b8;
  SpatialAcc local_88;
  IJoint *local_58;
  Link *local_50;
  LinkIndex local_48;
  Link *local_40;
  uint local_34;
  VectorDynSize *local_30;
  FreeFloatingVel *local_20;
  FreeFloatingPos *local_18;
  
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  for (local_34 = 0; uVar2 = local_34, uVar5 = Traversal::getNrOfVisitedLinks((Traversal *)0x3bc12d)
      , uVar2 < uVar5; local_34 = local_34 + 1) {
    local_40 = Traversal::getLink(in_stack_fffffffffffff140,
                                  (TraversalIndex)in_stack_fffffffffffff138);
    local_48 = Link::getIndex(local_40);
    local_50 = Traversal::getParentLink
                         (in_stack_fffffffffffff140,(TraversalIndex)in_stack_fffffffffffff138);
    local_58 = Traversal::getParentJoint
                         (in_stack_fffffffffffff140,(TraversalIndex)in_stack_fffffffffffff138);
    if (local_50 == (Link *)0x0) {
      pTVar7 = FreeFloatingVel::baseVel(local_20);
      this = LinkVelArray::operator()
                       ((LinkVelArray *)in_stack_fffffffffffff140,
                        (LinkIndex)in_stack_fffffffffffff138);
      iDynTree::Twist::operator=(this,pTVar7);
      SpatialVector<iDynTree::SpatialMotionVector>::Zero();
      iDynTree::SpatialAcc::SpatialAcc(&local_88,&local_b8);
      pSVar8 = LinkAccArray::operator()
                         ((LinkAccArray *)in_stack_fffffffffffff140,
                          (LinkIndex)in_stack_fffffffffffff138);
      iDynTree::SpatialAcc::operator=(pSVar8,&local_88);
    }
    else {
      local_c0 = Link::getIndex(local_50);
      iVar6 = (*local_58->_vptr_IJoint[4])();
      pIVar3 = local_58;
      if (iVar6 == 0) {
        pJVar9 = FreeFloatingPos::jointPos(local_18);
        LVar4 = local_48;
        LVar10 = Link::getIndex(local_50);
        iVar6 = (*pIVar3->_vptr_IJoint[10])(pIVar3,pJVar9,LVar4,LVar10);
        LinkVelArray::operator()
                  ((LinkVelArray *)in_stack_fffffffffffff140,(LinkIndex)in_stack_fffffffffffff138);
        iDynTree::Transform::operator*(local_f0,(Twist *)CONCAT44(extraout_var,iVar6));
        pTVar7 = LinkVelArray::operator()
                           ((LinkVelArray *)in_stack_fffffffffffff140,
                            (LinkIndex)in_stack_fffffffffffff138);
        iDynTree::Twist::operator=(pTVar7,(Twist *)local_f0);
        SpatialVector<iDynTree::SpatialMotionVector>::Zero();
        iDynTree::SpatialAcc::SpatialAcc(&local_120,&local_150);
        pSVar8 = LinkAccArray::operator()
                           ((LinkAccArray *)in_stack_fffffffffffff140,
                            (LinkIndex)in_stack_fffffffffffff138);
        iDynTree::SpatialAcc::operator=(pSVar8,&local_120);
      }
      else {
        iVar6 = (*local_58->_vptr_IJoint[0x18])();
        local_158 = CONCAT44(extraout_var_00,iVar6);
        (*local_58->_vptr_IJoint[0xc])(local_188,local_58,0,local_48,local_c0);
        __dest = DOFSpatialMotionArray::operator()
                           ((DOFSpatialMotionArray *)in_stack_fffffffffffff140,
                            (size_t)in_stack_fffffffffffff138);
        memcpy(__dest,local_188,0x30);
        iDynTree::Twist::Twist((Twist *)&local_1b8);
        pVVar11 = &FreeFloatingVel::jointVel(local_20)->super_VectorDynSize;
        local_1f0 = iDynTree::VectorDynSize::operator()(pVVar11,local_158);
        pSVar12 = &DOFSpatialMotionArray::operator()
                             ((DOFSpatialMotionArray *)in_stack_fffffffffffff140,
                              (size_t)in_stack_fffffffffffff138)->
                   super_SpatialVector<iDynTree::SpatialMotionVector>;
        SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3(pSVar12);
        toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff158);
        Eigen::operator*(in_stack_fffffffffffff188,in_stack_fffffffffffff180);
        SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3(&local_1b8);
        toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff158);
        Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
                  ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
                   in_stack_fffffffffffff140,in_stack_fffffffffffff138);
        pVVar11 = &FreeFloatingVel::jointVel(local_20)->super_VectorDynSize;
        local_248 = iDynTree::VectorDynSize::operator()(pVVar11,local_158);
        pSVar12 = &DOFSpatialMotionArray::operator()
                             ((DOFSpatialMotionArray *)in_stack_fffffffffffff140,
                              (size_t)in_stack_fffffffffffff138)->
                   super_SpatialVector<iDynTree::SpatialMotionVector>;
        SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(pSVar12);
        toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff158);
        Eigen::operator*(in_stack_fffffffffffff188,in_stack_fffffffffffff180);
        SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(&local_1b8);
        toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff158);
        Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
                  ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
                   in_stack_fffffffffffff140,in_stack_fffffffffffff138);
        pIVar3 = local_58;
        pJVar9 = FreeFloatingPos::jointPos(local_18);
        iVar6 = (*pIVar3->_vptr_IJoint[10])(pIVar3,pJVar9,local_48,local_c0);
        LinkVelArray::operator()
                  ((LinkVelArray *)in_stack_fffffffffffff140,(LinkIndex)in_stack_fffffffffffff138);
        iDynTree::Transform::operator*(local_2c8,(Twist *)CONCAT44(extraout_var_01,iVar6));
        iDynTree::Twist::operator+(local_298,(Twist *)local_2c8);
        pTVar7 = LinkVelArray::operator()
                           ((LinkVelArray *)in_stack_fffffffffffff140,
                            (LinkIndex)in_stack_fffffffffffff138);
        iDynTree::Twist::operator=(pTVar7,local_298);
        pTVar7 = LinkVelArray::operator()
                           ((LinkVelArray *)in_stack_fffffffffffff140,
                            (LinkIndex)in_stack_fffffffffffff138);
        iDynTree::Twist::operator*((Twist *)&local_2f8,pTVar7);
        pSVar8 = LinkAccArray::operator()
                           ((LinkAccArray *)in_stack_fffffffffffff140,
                            (LinkIndex)in_stack_fffffffffffff138);
        iDynTree::SpatialAcc::operator=(pSVar8,&local_2f8);
      }
    }
    pSVar13 = Link::getInertia(local_40);
    iDynTree::ArticulatedBodyInertia::ArticulatedBodyInertia(local_3d0,pSVar13);
    pAVar14 = LinkArticulatedBodyInertias::operator()
                        ((LinkArticulatedBodyInertias *)in_stack_fffffffffffff140,
                         (LinkIndex)in_stack_fffffffffffff138);
    memcpy(pAVar14,local_3d0,0xd8);
    pTVar7 = LinkVelArray::operator()
                       ((LinkVelArray *)in_stack_fffffffffffff140,
                        (LinkIndex)in_stack_fffffffffffff138);
    pSVar13 = Link::getInertia(local_40);
    LinkVelArray::operator()
              ((LinkVelArray *)in_stack_fffffffffffff140,(LinkIndex)in_stack_fffffffffffff138);
    iDynTree::SpatialInertia::operator*((SpatialInertia *)local_478,(Twist *)pSVar13);
    iDynTree::Twist::operator*((Twist *)&local_440,(SpatialMomentum *)pTVar7);
    LinkWrenches::operator()
              ((LinkWrenches *)in_stack_fffffffffffff140,(LinkIndex)in_stack_fffffffffffff138);
    iDynTree::Wrench::operator-(&local_408,&local_440);
    pWVar15 = LinkWrenches::operator()
                        ((LinkWrenches *)in_stack_fffffffffffff140,
                         (LinkIndex)in_stack_fffffffffffff138);
    iDynTree::Wrench::operator=(pWVar15,&local_408);
    Wrench::~Wrench((Wrench *)0x3bc7d5);
    Wrench::~Wrench((Wrench *)0x3bc7e2);
    SpatialMomentum::~SpatialMomentum((SpatialMomentum *)0x3bc7ef);
  }
  local_488 = Traversal::getNrOfVisitedLinks((Traversal *)0x3bc87e);
  while (local_488 = local_488 - 1, -1 < (int)local_488) {
    local_490 = Traversal::getLink(in_stack_fffffffffffff140,
                                   (TraversalIndex)in_stack_fffffffffffff138);
    local_498 = Link::getIndex(local_490);
    local_4a0 = Traversal::getParentLink
                          (in_stack_fffffffffffff140,(TraversalIndex)in_stack_fffffffffffff138);
    local_4a8 = Traversal::getParentJoint
                          (in_stack_fffffffffffff140,(TraversalIndex)in_stack_fffffffffffff138);
    if (local_4a0 != (Link *)0x0) {
      iDynTree::ArticulatedBodyInertia::ArticulatedBodyInertia((ArticulatedBodyInertia *)local_580);
      Wrench::Wrench((Wrench *)in_stack_fffffffffffff140);
      iVar6 = (*local_4a8->_vptr_IJoint[4])();
      if (iVar6 != 0) {
        iVar6 = (*local_4a8->_vptr_IJoint[0x18])();
        local_5c0 = CONCAT44(extraout_var_02,iVar6);
        pAVar14 = LinkArticulatedBodyInertias::operator()
                            ((LinkArticulatedBodyInertias *)in_stack_fffffffffffff140,
                             (LinkIndex)in_stack_fffffffffffff138);
        DOFSpatialMotionArray::operator()
                  ((DOFSpatialMotionArray *)in_stack_fffffffffffff140,
                   (size_t)in_stack_fffffffffffff138);
        iDynTree::ArticulatedBodyInertia::operator*(local_5f8,(SpatialMotionVector *)pAVar14);
        DOFSpatialForceArray::operator()
                  ((DOFSpatialForceArray *)in_stack_fffffffffffff140,
                   (size_t)in_stack_fffffffffffff138);
        SpatialForceVector::operator=
                  ((SpatialForceVector *)in_stack_fffffffffffff140,
                   (SpatialForceVector *)in_stack_fffffffffffff138);
        iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_5f8);
        DOFSpatialMotionArray::operator()
                  ((DOFSpatialMotionArray *)in_stack_fffffffffffff140,
                   (size_t)in_stack_fffffffffffff138);
        DOFSpatialForceArray::operator()
                  ((DOFSpatialForceArray *)in_stack_fffffffffffff140,
                   (size_t)in_stack_fffffffffffff138);
        dVar19 = SpatialVector<iDynTree::SpatialMotionVector>::dot
                           (in_stack_fffffffffffff160,in_stack_fffffffffffff158);
        pdVar16 = (double *)
                  iDynTree::VectorDynSize::operator()
                            ((VectorDynSize *)(in_stack_00000008 + 0x30),local_5c0);
        *pdVar16 = dVar19;
        dVar19 = (double)iDynTree::VectorDynSize::operator()(local_30,local_5c0);
        DOFSpatialMotionArray::operator()
                  ((DOFSpatialMotionArray *)in_stack_fffffffffffff140,
                   (size_t)in_stack_fffffffffffff138);
        LinkWrenches::operator()
                  ((LinkWrenches *)in_stack_fffffffffffff140,(LinkIndex)in_stack_fffffffffffff138);
        dVar20 = SpatialVector<iDynTree::SpatialMotionVector>::dot
                           (in_stack_fffffffffffff160,in_stack_fffffffffffff158);
        pdVar16 = (double *)
                  iDynTree::VectorDynSize::operator()
                            ((VectorDynSize *)(in_stack_00000008 + 0x50),local_5c0);
        *pdVar16 = dVar19 - dVar20;
        pAVar14 = LinkArticulatedBodyInertias::operator()
                            ((LinkArticulatedBodyInertias *)in_stack_fffffffffffff140,
                             (LinkIndex)in_stack_fffffffffffff138);
        DOFSpatialForceArray::operator()
                  ((DOFSpatialForceArray *)in_stack_fffffffffffff140,
                   (size_t)in_stack_fffffffffffff138);
        pdVar16 = (double *)
                  iDynTree::VectorDynSize::operator()
                            ((VectorDynSize *)(in_stack_00000008 + 0x30),local_5c0);
        iDynTree::ArticulatedBodyInertia::ABADyadHelper(local_7a8,*pdVar16);
        iDynTree::ArticulatedBodyInertia::operator-(local_6d0,pAVar14);
        memcpy(local_580,local_6d0,0xd8);
        pWVar15 = LinkWrenches::operator()
                            ((LinkWrenches *)in_stack_fffffffffffff140,
                             (LinkIndex)in_stack_fffffffffffff138);
        LinkAccArray::operator()
                  ((LinkAccArray *)in_stack_fffffffffffff140,(LinkIndex)in_stack_fffffffffffff138);
        iDynTree::ArticulatedBodyInertia::operator*(local_850,local_580);
        iDynTree::Wrench::operator+(&local_818,pWVar15);
        DOFSpatialForceArray::operator()
                  ((DOFSpatialForceArray *)in_stack_fffffffffffff140,
                   (size_t)in_stack_fffffffffffff138);
        pdVar16 = (double *)
                  iDynTree::VectorDynSize::operator()
                            ((VectorDynSize *)(in_stack_00000008 + 0x50),local_5c0);
        dVar19 = *pdVar16;
        pdVar16 = (double *)
                  iDynTree::VectorDynSize::operator()
                            ((VectorDynSize *)(in_stack_00000008 + 0x30),local_5c0);
        iDynTree::SpatialForceVector::operator*(local_8c0,dVar19 / *pdVar16);
        iDynTree::Wrench::Wrench(&local_888,local_8c0);
        iDynTree::Wrench::operator+(&local_7e0,&local_818);
        iDynTree::Wrench::operator=(&local_5b8,&local_7e0);
        Wrench::~Wrench((Wrench *)0x3bce04);
        Wrench::~Wrench((Wrench *)0x3bce11);
        iDynTree::SpatialForceVector::~SpatialForceVector(local_8c0);
        Wrench::~Wrench((Wrench *)0x3bce2b);
        Wrench::~Wrench((Wrench *)0x3bce38);
      }
      iVar6 = (*local_4a8->_vptr_IJoint[4])();
      if (iVar6 == 0) {
        pAVar14 = LinkArticulatedBodyInertias::operator()
                            ((LinkArticulatedBodyInertias *)in_stack_fffffffffffff140,
                             (LinkIndex)in_stack_fffffffffffff138);
        memcpy(local_580,pAVar14,0xd8);
        pWVar15 = LinkWrenches::operator()
                            ((LinkWrenches *)in_stack_fffffffffffff140,
                             (LinkIndex)in_stack_fffffffffffff138);
        LinkAccArray::operator()
                  ((LinkAccArray *)in_stack_fffffffffffff140,(LinkIndex)in_stack_fffffffffffff138);
        iDynTree::ArticulatedBodyInertia::operator*(local_930,local_580);
        iDynTree::Wrench::operator+(&local_8f8,pWVar15);
        iDynTree::Wrench::operator=(&local_5b8,&local_8f8);
        Wrench::~Wrench((Wrench *)0x3bd049);
        Wrench::~Wrench((Wrench *)0x3bd056);
      }
      local_938 = Link::getIndex(local_4a0);
      pIVar3 = local_4a8;
      pJVar9 = FreeFloatingPos::jointPos(local_18);
      iVar6 = (*pIVar3->_vptr_IJoint[10])(pIVar3,pJVar9,local_938,local_498);
      iDynTree::Transform::Transform
                ((Transform *)&local_998,(Transform *)CONCAT44(extraout_var_03,iVar6));
      iDynTree::Transform::operator*(local_a70,(ArticulatedBodyInertia *)&local_998);
      pAVar14 = LinkArticulatedBodyInertias::operator()
                          ((LinkArticulatedBodyInertias *)in_stack_fffffffffffff140,
                           (LinkIndex)in_stack_fffffffffffff138);
      iDynTree::ArticulatedBodyInertia::operator+=(pAVar14,(ArticulatedBodyInertia *)local_a70);
      pWVar15 = LinkWrenches::operator()
                          ((LinkWrenches *)in_stack_fffffffffffff140,
                           (LinkIndex)in_stack_fffffffffffff138);
      iDynTree::Transform::operator*(local_ae0,&local_998);
      iDynTree::Wrench::operator+(&local_aa8,pWVar15);
      pWVar15 = LinkWrenches::operator()
                          ((LinkWrenches *)in_stack_fffffffffffff140,
                           (LinkIndex)in_stack_fffffffffffff138);
      iDynTree::Wrench::operator=(pWVar15,&local_aa8);
      Wrench::~Wrench((Wrench *)0x3bd237);
      Wrench::~Wrench((Wrench *)0x3bd244);
      Wrench::~Wrench((Wrench *)0x3bd251);
    }
  }
  for (local_ae4 = 0; uVar2 = local_ae4,
      uVar5 = Traversal::getNrOfVisitedLinks((Traversal *)0x3bd2e4), uVar2 < uVar5;
      local_ae4 = local_ae4 + 1) {
    local_af0 = Traversal::getLink(in_stack_fffffffffffff140,
                                   (TraversalIndex)in_stack_fffffffffffff138);
    local_af8 = Link::getIndex(local_af0);
    local_b00 = Traversal::getParentLink
                          (in_stack_fffffffffffff140,(TraversalIndex)in_stack_fffffffffffff138);
    local_b08 = (Traversal *)
                Traversal::getParentJoint
                          (in_stack_fffffffffffff140,(TraversalIndex)in_stack_fffffffffffff138);
    if (local_b00 == (Link *)0x0) {
      LinkArticulatedBodyInertias::operator()
                ((LinkArticulatedBodyInertias *)in_stack_fffffffffffff140,
                 (LinkIndex)in_stack_fffffffffffff138);
      LinkWrenches::operator()
                ((LinkWrenches *)in_stack_fffffffffffff140,(LinkIndex)in_stack_fffffffffffff138);
      iDynTree::ArticulatedBodyInertia::applyInverse((Wrench *)local_b68);
      iDynTree::SpatialAcc::operator-((SpatialAcc *)(local_b68 + 0x30));
      pSVar8 = LinkAccArray::operator()
                         ((LinkAccArray *)in_stack_fffffffffffff140,
                          (LinkIndex)in_stack_fffffffffffff138);
      iDynTree::SpatialAcc::operator=(pSVar8,(SpatialAcc *)(local_b68 + 0x30));
      pSVar8 = LinkAccArray::operator()
                         ((LinkAccArray *)in_stack_fffffffffffff140,
                          (LinkIndex)in_stack_fffffffffffff138);
      pSVar17 = FreeFloatingAcc::baseAcc(in_stack_00000010);
      iDynTree::SpatialAcc::operator=(pSVar17,pSVar8);
    }
    else {
      local_b70 = Link::getIndex(local_b00);
      iVar6 = (*(code *)(local_b08->links).
                        super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[4])();
      if (iVar6 == 0) {
        in_stack_fffffffffffff140 = local_b08;
        pJVar9 = FreeFloatingPos::jointPos(local_18);
        iVar6 = (*(code *)(in_stack_fffffffffffff140->links).
                          super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[10])
                          (in_stack_fffffffffffff140,pJVar9,local_af8,local_b70);
        LinkAccArray::operator()
                  ((LinkAccArray *)in_stack_fffffffffffff140,(LinkIndex)in_stack_fffffffffffff138);
        iDynTree::Transform::operator*
                  ((Transform *)&local_cc8,(SpatialAcc *)CONCAT44(extraout_var_06,iVar6));
        LinkAccArray::operator()
                  ((LinkAccArray *)in_stack_fffffffffffff140,(LinkIndex)in_stack_fffffffffffff138);
        iDynTree::SpatialAcc::operator+(&local_c98,&local_cc8);
        pSVar8 = LinkAccArray::operator()
                           ((LinkAccArray *)in_stack_fffffffffffff140,
                            (LinkIndex)in_stack_fffffffffffff138);
        iDynTree::SpatialAcc::operator=(pSVar8,&local_c98);
      }
      else {
        iVar6 = (*(code *)(local_b08->links).
                          super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[0x18])();
        pTVar1 = local_b08;
        local_b78 = CONCAT44(extraout_var_04,iVar6);
        pJVar9 = FreeFloatingPos::jointPos(local_18);
        iVar6 = (*(code *)(pTVar1->links).
                          super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[10])
                          (pTVar1,pJVar9,local_af8,local_b70);
        pSVar8 = (SpatialAcc *)CONCAT44(extraout_var_05,iVar6);
        LinkAccArray::operator()
                  ((LinkAccArray *)in_stack_fffffffffffff140,(LinkIndex)in_stack_fffffffffffff138);
        iDynTree::Transform::operator*((Transform *)&local_bd8,pSVar8);
        LinkAccArray::operator()
                  ((LinkAccArray *)in_stack_fffffffffffff140,(LinkIndex)in_stack_fffffffffffff138);
        iDynTree::SpatialAcc::operator+(&local_ba8,&local_bd8);
        pSVar17 = LinkAccArray::operator()
                            ((LinkAccArray *)in_stack_fffffffffffff140,
                             (LinkIndex)in_stack_fffffffffffff138);
        iDynTree::SpatialAcc::operator=(pSVar17,&local_ba8);
        pdVar16 = (double *)
                  iDynTree::VectorDynSize::operator()
                            ((VectorDynSize *)(in_stack_00000008 + 0x50),local_b78);
        dVar19 = *pdVar16;
        pSVar18 = DOFSpatialForceArray::operator()
                            ((DOFSpatialForceArray *)in_stack_fffffffffffff140,
                             (size_t)in_stack_fffffffffffff138);
        this_00 = (SpatialVector<iDynTree::SpatialForceVector> *)(pSVar18 + 8);
        LinkAccArray::operator()
                  ((LinkAccArray *)in_stack_fffffffffffff140,(LinkIndex)in_stack_fffffffffffff138);
        dVar21 = SpatialVector<iDynTree::SpatialForceVector>::dot
                           (this_00,&pSVar8->super_SpatialMotionVector);
        pdVar16 = (double *)
                  iDynTree::VectorDynSize::operator()
                            ((VectorDynSize *)(in_stack_00000008 + 0x30),local_b78);
        dVar20 = *pdVar16;
        pVVar11 = &FreeFloatingAcc::jointAcc(in_stack_00000010)->super_VectorDynSize;
        pdVar16 = (double *)iDynTree::VectorDynSize::operator()(pVVar11,local_b78);
        *pdVar16 = (dVar19 - dVar21) / dVar20;
        pSVar8 = LinkAccArray::operator()
                           ((LinkAccArray *)in_stack_fffffffffffff140,
                            (LinkIndex)in_stack_fffffffffffff138);
        DOFSpatialMotionArray::operator()
                  ((DOFSpatialMotionArray *)in_stack_fffffffffffff140,
                   (size_t)in_stack_fffffffffffff138);
        pVVar11 = &FreeFloatingAcc::jointAcc(in_stack_00000010)->super_VectorDynSize;
        pdVar16 = (double *)iDynTree::VectorDynSize::operator()(pVVar11,local_b78);
        iDynTree::SpatialMotionVector::operator*(&local_c68,*pdVar16);
        iDynTree::SpatialAcc::SpatialAcc(&local_c38,&local_c68);
        iDynTree::SpatialAcc::operator+(&local_c08,pSVar8);
        pSVar8 = LinkAccArray::operator()
                           ((LinkAccArray *)in_stack_fffffffffffff140,
                            (LinkIndex)in_stack_fffffffffffff138);
        iDynTree::SpatialAcc::operator=(pSVar8,&local_c08);
      }
    }
  }
  return true;
}

Assistant:

bool ArticulatedBodyAlgorithm(const Model& model,
                              const Traversal& traversal,
                              const FreeFloatingPos& robotPos,
                              const FreeFloatingVel& robotVel,
                              const LinkNetExternalWrenches & linkExtWrenches,
                              const JointDOFsDoubleArray & jointTorques,
                                    ArticulatedBodyAlgorithmInternalBuffers & bufs,
                                    FreeFloatingAcc & robotAcc)
{
    /**
     * Forward pass: compute the link velocities and the link bias accelerations
     * and initialize the Articulated Body Inertia and the articulated bias wrench.
     */
    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex visitedLinkIndex = visitedLink->getIndex();
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        // Propagate velocities and bias accelerations

        // If the visitedLink is the base one, initialize the velocity with the input velocity
        if( parentLink == 0 )
        {
            assert(visitedLinkIndex >= 0 && visitedLinkIndex < (LinkIndex)model.getNrOfLinks());
            bufs.linksVel(visitedLinkIndex) = robotVel.baseVel();
            bufs.linksBiasAcceleration(visitedLinkIndex) = SpatialAcc::Zero();
        }
        else
        {
            LinkIndex    parentLinkIndex = parentLink->getIndex();
            // Otherwise we propagate velocity in the usual way
            if( toParentJoint->getNrOfDOFs() == 0 )
            {
                bufs.linksVel(visitedLinkIndex) =
                    toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLink->getIndex())*bufs.linksVel(parentLinkIndex);
                bufs.linksBiasAcceleration(visitedLinkIndex) = SpatialAcc::Zero();
            }
            else
            {
                size_t dofIndex = toParentJoint->getDOFsOffset();
                bufs.S(dofIndex) = toParentJoint->getMotionSubspaceVector(0,visitedLinkIndex,parentLinkIndex);
                Twist vj;
                toEigen(vj.getLinearVec3()) = robotVel.jointVel()(dofIndex)*toEigen(bufs.S(dofIndex).getLinearVec3());
                toEigen(vj.getAngularVec3()) = robotVel.jointVel()(dofIndex)*toEigen(bufs.S(dofIndex).getAngularVec3());
                bufs.linksVel(visitedLinkIndex) =
                    toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLinkIndex)*bufs.linksVel(parentLinkIndex)
                    + vj;
                bufs.linksBiasAcceleration(visitedLinkIndex) = bufs.linksVel(visitedLinkIndex)*vj;

            }
        }

        // Initialize Articulated Body Inertia
        bufs.linkABIs(visitedLinkIndex) = visitedLink->getInertia();

        // Initialize bias force (note that we assume that the external frames are
        // expressed in a local frame, differently from Featherstone 2008
        bufs.linksBiasWrench(visitedLinkIndex) = bufs.linksVel(visitedLinkIndex)*(visitedLink->getInertia()*bufs.linksVel(visitedLinkIndex))
                                            - linkExtWrenches(visitedLinkIndex);
    }

    /*
     * Backward pass: recursivly compute
     * the articulated body inertia and the articulated body bias wrench.
     *
     */
    for(int traversalEl = traversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex    visitedLinkIndex = visitedLink->getIndex();
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        if( parentLink )
        {
            ArticulatedBodyInertia Ia;
            Wrench pa;

            // For now we support only 0 and 1 dof joints

            // for 1 dof joints, the articulated inertia
            // need to be propagated to the parent considering
            // the joints
            if( toParentJoint->getNrOfDOFs() > 0 )
            {
                assert(toParentJoint->getNrOfDOFs()==1);
                size_t dofIndex = toParentJoint->getDOFsOffset();
                bufs.U(dofIndex) = bufs.linkABIs(visitedLinkIndex)*bufs.S(dofIndex);
                bufs.D(dofIndex) = bufs.S(dofIndex).dot(bufs.U(dofIndex));
                bufs.u(dofIndex) = jointTorques(dofIndex) - bufs.S(dofIndex).dot(bufs.linksBiasWrench(visitedLinkIndex));

                Ia = bufs.linkABIs(visitedLinkIndex) - ArticulatedBodyInertia::ABADyadHelper(bufs.U(dofIndex),bufs.D(dofIndex));

                pa                 =   bufs.linksBiasWrench(visitedLinkIndex)
                                     + Ia*bufs.linksBiasAcceleration(visitedLinkIndex)
                                     + bufs.U(dofIndex)*(bufs.u(dofIndex)/bufs.D(dofIndex));

            }

            // For fixed joints, we just need to propate
            // the articulated quantities without considering the
            // joint
            if( toParentJoint->getNrOfDOFs() == 0 )
            {
                Ia = bufs.linkABIs(visitedLinkIndex);
                pa                 =   bufs.linksBiasWrench(visitedLinkIndex)
                                     + Ia*bufs.linksBiasAcceleration(visitedLinkIndex);
            }

            //bufs.pa(visitedLinkIndex) = pa;

            // Propagate
            LinkIndex parentLinkIndex = parentLink->getIndex();
            Transform parent_X_visited = toParentJoint->getTransform(robotPos.jointPos(),parentLinkIndex,visitedLinkIndex);
            bufs.linkABIs(parentLinkIndex)        += parent_X_visited*Ia;
            bufs.linksBiasWrench(parentLinkIndex) = bufs.linksBiasWrench(parentLinkIndex) + parent_X_visited*pa;
        }
    }

    /**
     * Second forward pass: find robot accelerations
     *
     */
    // \todo TODO Handle gravity
    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
       LinkConstPtr visitedLink = traversal.getLink(traversalEl);
       LinkIndex visitedLinkIndex = visitedLink->getIndex();
       LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
       IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

       if( parentLink == 0 )
       {
           // Preliminary step: find base acceleration
           bufs.linksAccelerations(visitedLinkIndex) = -(bufs.linkABIs(visitedLinkIndex).applyInverse(bufs.linksBiasWrench(visitedLinkIndex)));

           robotAcc.baseAcc() = bufs.linksAccelerations(visitedLinkIndex);
       }
       else
       {
           LinkIndex    parentLinkIndex = parentLink->getIndex();
           if( toParentJoint->getNrOfDOFs() > 0 )
           {
               size_t dofIndex = toParentJoint->getDOFsOffset();
               assert(toParentJoint->getNrOfDOFs()==1);
               bufs.linksAccelerations(visitedLinkIndex) =
                   toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLinkIndex)*bufs.linksAccelerations(parentLinkIndex)
                   + bufs.linksBiasAcceleration(visitedLinkIndex);
               robotAcc.jointAcc()(dofIndex) = (bufs.u(dofIndex)-bufs.U(dofIndex).dot(bufs.linksAccelerations(visitedLinkIndex)))/bufs.D(dofIndex);
               bufs.linksAccelerations(visitedLinkIndex) = bufs.linksAccelerations(visitedLinkIndex) + bufs.S(dofIndex)*robotAcc.jointAcc()(dofIndex);
           }
           else
           {
               //for fixed joints we just propagate the acceleration
               bufs.linksAccelerations(visitedLinkIndex) =
                   toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLinkIndex)*bufs.linksAccelerations(parentLinkIndex)
                   + bufs.linksBiasAcceleration(visitedLinkIndex);
           }
       }
    }

    return true;
}